

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferActiveUniformValidation::addTextureParam
          (TextureBufferActiveUniformValidation *this,GLenum uniformType,GLenum format,GLuint size,
          char *name,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params)

{
  TextureParameters texParam;
  undefined1 local_40 [48];
  
  TextureParameters::TextureParameters((TextureParameters *)local_40,size,format,uniformType,name);
  std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::push_back
            (params,(TextureParameters *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::addTextureParam(glw::GLenum uniformType, glw::GLenum format,
														   glw::GLuint size, const char* name,
														   std::vector<TextureParameters>* params)
{
	TextureParameters texParam(size, format, uniformType, name);
	params->push_back(texParam);
}